

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O0

int OBJ_obj2txt(char *buf,int buf_len,ASN1_OBJECT *a,int no_name)

{
  int iVar1;
  char *src;
  int ret;
  char *txt;
  CBS cbs;
  char *name;
  int nid;
  int always_return_oid_local;
  ASN1_OBJECT *obj_local;
  int out_len_local;
  char *out_local;
  
  if ((a == (ASN1_OBJECT *)0x0) || (a->length == 0)) {
    out_local._4_4_ = strlcpy_int(buf,"",buf_len);
  }
  else {
    if ((no_name == 0) && (iVar1 = OBJ_obj2nid(a), iVar1 != 0)) {
      cbs.len = (size_t)OBJ_nid2ln(iVar1);
      if ((char *)cbs.len == (char *)0x0) {
        cbs.len = (size_t)OBJ_nid2sn(iVar1);
      }
      if (cbs.len != 0) {
        iVar1 = strlcpy_int(buf,(char *)cbs.len,buf_len);
        return iVar1;
      }
    }
    CBS_init((CBS *)&txt,a->data,(long)a->length);
    src = CBS_asn1_oid_to_text((CBS *)&txt);
    if (src == (char *)0x0) {
      if (0 < buf_len) {
        *buf = '\0';
      }
      out_local._4_4_ = -1;
    }
    else {
      out_local._4_4_ = strlcpy_int(buf,src,buf_len);
      OPENSSL_free(src);
    }
  }
  return out_local._4_4_;
}

Assistant:

int OBJ_obj2txt(char *out, int out_len, const ASN1_OBJECT *obj,
                int always_return_oid) {
  // Python depends on the empty OID successfully encoding as the empty
  // string.
  if (obj == NULL || obj->length == 0) {
    return strlcpy_int(out, "", out_len);
  }

  if (!always_return_oid) {
    int nid = OBJ_obj2nid(obj);
    if (nid != NID_undef) {
      const char *name = OBJ_nid2ln(nid);
      if (name == NULL) {
        name = OBJ_nid2sn(nid);
      }
      if (name != NULL) {
        return strlcpy_int(out, name, out_len);
      }
    }
  }

  CBS cbs;
  CBS_init(&cbs, obj->data, obj->length);
  char *txt = CBS_asn1_oid_to_text(&cbs);
  if (txt == NULL) {
    if (out_len > 0) {
      out[0] = '\0';
    }
    return -1;
  }

  int ret = strlcpy_int(out, txt, out_len);
  OPENSSL_free(txt);
  return ret;
}